

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

int Abc_SclHasDelayInfo(void *pScl)

{
  SC_Cell *pCell_00;
  SC_Timing *pSVar1;
  SC_Timing *pTime;
  SC_Cell *pCell;
  SC_Lib *p;
  void *pScl_local;
  
  pCell_00 = Abc_SclFindInvertor((SC_Lib *)pScl,0);
  if (pCell_00 == (SC_Cell *)0x0) {
    pScl_local._4_4_ = 0;
  }
  else {
    pSVar1 = Scl_CellPinTime(pCell_00,0);
    if (pSVar1 == (SC_Timing *)0x0) {
      pScl_local._4_4_ = 0;
    }
    else {
      pScl_local._4_4_ = 1;
    }
  }
  return pScl_local._4_4_;
}

Assistant:

int Abc_SclHasDelayInfo( void * pScl )
{
    SC_Lib * p = (SC_Lib *)pScl;
    SC_Cell * pCell;
    SC_Timing * pTime;
    pCell = Abc_SclFindInvertor(p, 0);
    if ( pCell == NULL )
        return 0;
    pTime = Scl_CellPinTime( pCell, 0 );
    if ( pTime == NULL )
        return 0;
    return 1;
}